

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void issue538b(void)

{
  roaring_bitmap_t *prVar1;
  roaring_bitmap_t *r2;
  roaring_bitmap_t *r;
  char *file;
  uint64_t unaff_retaddr;
  uint64_t in_stack_00000008;
  roaring_bitmap_t *expected;
  roaring_bitmap_t *shifted;
  roaring_bitmap_t *toshift_copy;
  roaring_bitmap_t *toshift;
  int shift;
  int64_t in_stack_00000040;
  roaring_bitmap_t *in_stack_00000048;
  int in_stack_ffffffffffffffcc;
  roaring_bitmap_t *in_stack_ffffffffffffffe8;
  uint32_t step;
  
  step = 0xffff0000;
  prVar1 = roaring_bitmap_from_range(in_stack_00000008,unaff_retaddr,0xffff0000);
  roaring_bitmap_set_copy_on_write(prVar1,true);
  prVar1 = roaring_bitmap_copy(in_stack_ffffffffffffffe8);
  r2 = roaring_bitmap_add_offset(in_stack_00000048,in_stack_00000040);
  roaring_bitmap_equals(prVar1,r2);
  r = roaring_bitmap_from_range(in_stack_00000008,unaff_retaddr,step);
  roaring_bitmap_set_copy_on_write(r,true);
  file = (char *)roaring_bitmap_get_cardinality(r2);
  roaring_bitmap_get_cardinality(r2);
  _assert_true((unsigned_long)r2,(char *)r,file,in_stack_ffffffffffffffcc);
  roaring_bitmap_equals(prVar1,r2);
  _assert_true((unsigned_long)r2,(char *)r,file,in_stack_ffffffffffffffcc);
  roaring_bitmap_free((roaring_bitmap_t *)0x10b39b);
  roaring_bitmap_free((roaring_bitmap_t *)0x10b3a5);
  roaring_bitmap_free((roaring_bitmap_t *)0x10b3af);
  roaring_bitmap_free((roaring_bitmap_t *)0x10b3b9);
  return;
}

Assistant:

DEFINE_TEST(issue538b) {
    int shift = -65536;
    roaring_bitmap_t *toshift = roaring_bitmap_from_range(131074, 131876, 1);
    roaring_bitmap_set_copy_on_write(toshift, 1);
    roaring_bitmap_t *toshift_copy = roaring_bitmap_copy(toshift);

    roaring_bitmap_t *shifted = roaring_bitmap_add_offset(toshift, shift);
    roaring_bitmap_equals(toshift, toshift_copy);

    roaring_bitmap_t *expected =
        roaring_bitmap_from_range(131074 + shift, 131876 + shift, 1);
    roaring_bitmap_set_copy_on_write(expected, 1);
    assert_true(roaring_bitmap_get_cardinality(toshift) ==
                roaring_bitmap_get_cardinality(expected));
    assert_true(roaring_bitmap_equals(shifted, expected));
    roaring_bitmap_free(toshift_copy);
    roaring_bitmap_free(toshift);
    roaring_bitmap_free(shifted);
    roaring_bitmap_free(expected);
}